

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O2

_Bool string_trim(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_class_t *pgVar1;
  long lVar2;
  ushort **ppuVar3;
  undefined6 in_register_00000012;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  gravity_value_t value;
  
  uVar5 = 0;
  uVar6 = 0;
  if (((int)CONCAT62(in_register_00000012,nargs) == 2) && (args[1].isa == gravity_class_int)) {
    uVar6 = 0;
    if (*(uint *)&args[1].field_1 < 3) {
      uVar6 = *(uint *)&args[1].field_1;
    }
  }
  pgVar1 = ((args->field_1).p)->objclass;
  uVar9 = *(uint *)((long)&((args->field_1).p)->identifier + 4);
  if (uVar6 < 2) {
    uVar7 = 0;
    uVar5 = 0;
    if (0 < (int)uVar9) {
      uVar5 = (ulong)uVar9;
    }
    for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      ppuVar3 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar3 + (long)*(char *)((long)&pgVar1->isa + uVar7) * 2 + 1) & 0x20)
          == 0) {
        uVar5 = uVar7 & 0xffffffff;
        break;
      }
    }
    if (uVar6 != 0) goto LAB_00128f1f;
  }
  uVar4 = (uint)uVar5;
  uVar6 = uVar9;
  if ((int)uVar4 < (int)uVar9) {
    uVar6 = uVar4;
  }
  lVar10 = (long)(int)uVar9;
  uVar8 = uVar9 + 1;
  do {
    uVar9 = uVar6;
    if (lVar10 <= (int)uVar4) break;
    ppuVar3 = __ctype_b_loc();
    lVar2 = lVar10 + -1;
    uVar9 = uVar8 - 1;
    lVar10 = lVar10 + -1;
    uVar8 = uVar9;
  } while ((*(byte *)((long)*ppuVar3 + (long)*(char *)((long)pgVar1 + lVar2) * 2 + 1) & 0x20) != 0);
LAB_00128f1f:
  value = gravity_string_to_value(vm,(char *)((long)&pgVar1->isa + uVar5),uVar9 - (int)uVar5);
  gravity_vm_setslot(vm,value,rindex);
  return true;
}

Assistant:

static bool string_trim (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    int32_t direction = 0; // means trim both left and right
    
    // optional second parameters to specify trim-left (1) or trim-right(2)
    // default is trim-both(0)
    if ((nargs == 2) && (VALUE_ISA_INT(GET_VALUE(1)))) {
        int32_t v = (int32_t)VALUE_AS_INT(GET_VALUE(1));
        if (v >= 0 && v <= 2) direction = v;
    }
    
    gravity_string_t *src = VALUE_AS_STRING(GET_VALUE(0));
    const char *s = src->s;
    int32_t index_left = 0;
    int32_t index_right = src->len;
    
    // process left
    if (direction == 0 || direction == 1) {
        for (int32_t i=0; i<index_right; ++i) {
            if (isspace(s[i])) ++index_left;
            else break;
        }
    }
    
    // process right
    if (direction == 0 || direction == 2) {
        for (int32_t i=index_right-1; i>=index_left; --i) {
            if (isspace(s[i])) --index_right;
            else break;
        }
    }
    
    // index_left and index_right now points to the right indexes
    uint32_t trim_len = (index_left - 0) + (src->len - index_right);
    gravity_value_t value = VALUE_FROM_STRING(vm, (const char *)&s[index_left], src->len - trim_len);
    RETURN_VALUE(value, rindex);
}